

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMassSetup(void *arkode_mem,realtype t,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  double dVar1;
  bool bVar2;
  SUNLinearSolver_Type SVar3;
  int iVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int retval;
  int call_lssetup;
  int call_mvsetup;
  int call_mtsetup;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  SUNMatrix in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                                (ARKodeMem *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (local_4 == 0) {
    SVar3 = SUNLinSolGetType((SUNLinearSolver)0x114fd62);
    if (SVar3 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
      in_stack_ffffffffffffffc0[0x38] = 0;
      local_4 = in_stack_ffffffffffffffc0[0x38];
    }
    else if (in_stack_ffffffffffffffc8->uround * 100.0 <=
             ABS(*(double *)(in_stack_ffffffffffffffc0 + 0x10) - dVar1)) {
      bVar2 = false;
      if ((*(long *)(in_stack_ffffffffffffffc0 + 0x32) != 0) &&
         ((in_stack_ffffffffffffffc0[0xe] != 0 || (*(long *)(in_stack_ffffffffffffffc0 + 0x16) == 0)
          ))) {
        bVar2 = true;
      }
      if (bVar2) {
        iVar4 = (**(code **)(in_stack_ffffffffffffffc0 + 0x32))
                          (in_XMM0_Da,*(undefined8 *)(in_stack_ffffffffffffffc0 + 0x36));
        in_stack_ffffffffffffffc0[0x38] = iVar4;
        *(long *)(in_stack_ffffffffffffffc0 + 0x16) =
             *(long *)(in_stack_ffffffffffffffc0 + 0x16) + 1;
        *(double *)(in_stack_ffffffffffffffc0 + 0x10) = dVar1;
        if (in_stack_ffffffffffffffc0[0x38] != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,
                          (int)(ulong)(uint)in_stack_ffffffffffffffc0[0x38],"ARKLS","arkLsMassSetup"
                          ,
                          "The mass matrix x vector setup routine failed in an unrecoverable manner."
                         );
          return in_stack_ffffffffffffffc0[0x38];
        }
      }
      if (*(long *)(in_stack_ffffffffffffffc0 + 4) == 0) {
        uVar5 = (uint)(*(long *)(in_stack_ffffffffffffffc0 + 0x2a) != 0);
        bVar2 = false;
      }
      else {
        if ((in_stack_ffffffffffffffc0[0xe] == 0) &&
           (0 < *(long *)(in_stack_ffffffffffffffc0 + 0x12))) {
          in_stack_ffffffffffffffc0[0x38] = 0;
          return in_stack_ffffffffffffffc0[0x38];
        }
        if ((*in_stack_ffffffffffffffc0 == 0) &&
           (iVar4 = SUNMatZero((SUNMatrix)CONCAT44(in_stack_ffffffffffffffb4,local_4)), iVar4 != 0))
        {
          arkProcessError(in_stack_ffffffffffffffc8,-0xb,"ARKLS","arkLsMassSetup",
                          "A SUNMatrix routine failed in an unrecoverable manner.");
          in_stack_ffffffffffffffc0[0x38] = -0xb;
          return in_stack_ffffffffffffffc0[0x38];
        }
        local_4 = (**(code **)(in_stack_ffffffffffffffc0 + 2))
                            (in_XMM0_Da,*(undefined8 *)(in_stack_ffffffffffffffc0 + 4),
                             *(undefined8 *)(in_stack_ffffffffffffffc0 + 8),in_RSI,in_RDX,in_RCX);
        *(double *)(in_stack_ffffffffffffffc0 + 0x10) = dVar1;
        if (local_4 < 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-9,"ARKLS","arkLsMassSetup",
                          "The mass matrix routine failed in an unrecoverable manner.");
          in_stack_ffffffffffffffc0[0x38] = -9;
          return -1;
        }
        if (0 < local_4) {
          in_stack_ffffffffffffffc0[0x38] = -10;
          return 1;
        }
        if (*in_stack_ffffffffffffffc0 == 0) {
          iVar4 = SUNMatCopy((SUNMatrix)CONCAT44(in_stack_ffffffffffffffb4,local_4),
                             in_stack_ffffffffffffffa8);
          if (iVar4 != 0) {
            arkProcessError(in_stack_ffffffffffffffc8,-0xb,"ARKLS","arkLsMassSetup",
                            "A SUNMatrix routine failed in an unrecoverable manner.");
            in_stack_ffffffffffffffc0[0x38] = -0xb;
            return in_stack_ffffffffffffffc0[0x38];
          }
          local_4 = 0;
        }
        if ((*(long *)(in_stack_ffffffffffffffc0 + 0x34) == 0) &&
           (*(long *)(*(long *)(*(long *)(in_stack_ffffffffffffffc0 + 4) + 8) + 0x38) != 0)) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        uVar5 = 1;
      }
      if (bVar2) {
        iVar4 = SUNMatMatvecSetup((SUNMatrix)CONCAT44(uVar5,local_4));
        *(long *)(in_stack_ffffffffffffffc0 + 0x1a) =
             *(long *)(in_stack_ffffffffffffffc0 + 0x1a) + 1;
        if (iVar4 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0xb,"ARKLS","arkLsMassSetup",
                          "A SUNMatrix routine failed in an unrecoverable manner.");
          in_stack_ffffffffffffffc0[0x38] = -0xb;
          return in_stack_ffffffffffffffc0[0x38];
        }
        local_4 = 0;
      }
      if (uVar5 != 0) {
        iVar4 = SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar5,local_4),in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffc0[0x38] = iVar4;
        *(long *)(in_stack_ffffffffffffffc0 + 0x12) =
             *(long *)(in_stack_ffffffffffffffc0 + 0x12) + 1;
      }
      local_4 = in_stack_ffffffffffffffc0[0x38];
    }
    else {
      in_stack_ffffffffffffffc0[0x38] = 0;
      local_4 = in_stack_ffffffffffffffc0[0x38];
    }
  }
  return local_4;
}

Assistant:

int arkLsMassSetup(void *arkode_mem, realtype t, N_Vector vtemp1,
                   N_Vector vtemp2, N_Vector vtemp3)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  booleantype  call_mtsetup, call_mvsetup, call_lssetup;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassSetup",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return(arkls_mem->last_flag);
  }

  /* if the most recent setup essentially matches the current time,
     just return with success */
  if (SUNRabs(arkls_mem->msetuptime - t) < FUZZ_FACTOR*ark_mem->uround) {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return(arkls_mem->last_flag);
  }

  /* Determine whether to call user-provided mtsetup routine */
  call_mtsetup = SUNFALSE;
  if ( (arkls_mem->mtsetup) &&
       (arkls_mem->time_dependent || (arkls_mem->nmtsetup == 0)) )
    call_mtsetup = SUNTRUE;

  /* call user-provided mtsetup routine if applicable */
  if (call_mtsetup) {
    arkls_mem->last_flag = arkls_mem->mtsetup(t, arkls_mem->mt_data);
    arkls_mem->nmtsetup++;
    arkls_mem->msetuptime = t;
    if (arkls_mem->last_flag != 0) {
      arkProcessError(ark_mem, arkls_mem->last_flag, "ARKLS",
                      "arkLsMassSetup", MSG_LS_MTSETUP_FAILED);
      return(arkls_mem->last_flag);
    }
  }

  /* Perform user-facing setup based on whether this is matrix-free */
  if (arkls_mem->M == NULL) {

    /*** matrix-free -- only call LS setup if preconditioner setup exists ***/
    call_lssetup = (arkls_mem->pset != NULL);
    /*** matrix-free -- dont call matvec setup ***/
    call_mvsetup = SUNFALSE;

  } else {

    /*** matrix-based ***/

    /* If mass matrix is not time dependent, and if it has been set up
       previously, then just reuse existing matrix and factorization */
    if (!arkls_mem->time_dependent && (arkls_mem->nmsetups > 0)) {
      arkls_mem->last_flag = ARKLS_SUCCESS;
      return(arkls_mem->last_flag);
    }

    /* Clear the mass matrix if necessary (direct linear solvers) */
    if (!(arkls_mem->iterative)) {
      retval = SUNMatZero(arkls_mem->M);
      if (retval) {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                        "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return(arkls_mem->last_flag);
      }
    }

    /* Call user-supplied routine to fill the mass matrix */
    retval = arkls_mem->mass(t, arkls_mem->M, arkls_mem->M_data,
                             vtemp1, vtemp2, vtemp3);
    arkls_mem->msetuptime = t;
    if (retval < 0) {
      arkProcessError(ark_mem, ARKLS_MASSFUNC_UNRECVR, "ARKLS",
                      "arkLsMassSetup",  MSG_LS_MASSFUNC_FAILED);
      arkls_mem->last_flag = ARKLS_MASSFUNC_UNRECVR;
      return(-1);
    }
    if (retval > 0) {
      arkls_mem->last_flag = ARKLS_MASSFUNC_RECVR;
      return(1);
    }

    /* Copy M into M_lu for factorization (direct linear solvers) */
    if (!(arkls_mem->iterative)) {
      retval = SUNMatCopy(arkls_mem->M, arkls_mem->M_lu);
      if (retval) {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                        "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return(arkls_mem->last_flag);
      }
    }

    /* signal call to matvec setup routine only if the user didn't provide
       mtimes and the SUNMatrix implements the matvecsetup routine */
    if ((!arkls_mem->mtimes) && (arkls_mem->M->ops->matvecsetup))
      call_mvsetup = SUNTRUE;
    else
      call_mvsetup = SUNFALSE;

    /* signal call to LS setup routine */
    call_lssetup = SUNTRUE;

  }

  /* Call matvec setup routine if applicable */
  if (call_mvsetup) {
    retval = SUNMatMatvecSetup(arkls_mem->M);
    arkls_mem->nmvsetup++;
    if (retval) {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, "ARKLS",
                      "arkLsMassSetup",  MSG_LS_SUNMAT_FAILED);
      arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
      return(arkls_mem->last_flag);
    }
  }

  /* Call LS setup routine if applicable, and return */
  if (call_lssetup) {
    arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS,
                                          arkls_mem->M_lu);
    arkls_mem->nmsetups++;
  }

  return(arkls_mem->last_flag);
}